

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

QString * __thiscall
VcprojGenerator::retrievePlatformToolSet(QString *__return_storage_ptr__,VcprojGenerator *this)

{
  QMakeProject *this_00;
  long in_FS_OFFSET;
  ProKey PStack_108;
  ProString local_d8;
  QArrayDataPointer<char16_t> local_a8;
  QStringBuilder<QString,_ProString> local_90;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_48);
  if (local_48.size == 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_a8,L"v",1);
    this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&PStack_108,"MSVC_TOOLSET_VER");
    QMakeEvaluator::first(&local_d8,&this_00->super_QMakeEvaluator,&PStack_108);
    QStringBuilder<QString,_ProString>::QStringBuilder(&local_90,(QString *)&local_a8,&local_d8);
    QStringBuilder<QString,_ProString>::convertTo<QString>(__return_storage_ptr__,&local_90);
    QStringBuilder<QString,_ProString>::~QStringBuilder(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  else {
    QString::QString(__return_storage_ptr__,(QByteArray *)&local_48);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::retrievePlatformToolSet() const
{
    // The PlatformToolset string corresponds to the name of a directory in
    // $(VCTargetsPath)\Platforms\{Win32,x64,...}\PlatformToolsets
    // e.g. v90, v100, v110, v110_xp, v120_CTP_Nov, v120, or WindowsSDK7.1

    // This environment variable may be set by a commandline build
    // environment such as the Windows SDK command prompt
    QByteArray envVar = qgetenv("PlatformToolset");
    if (!envVar.isEmpty())
        return envVar;

    return u"v"_s + project->first("MSVC_TOOLSET_VER");
}